

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_SetPublishingMode
               (UA_Server *server,UA_Session *session,UA_SetPublishingModeRequest *request,
               UA_SetPublishingModeResponse *response)

{
  size_t __nmemb;
  UA_UInt32 *pUVar1;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  size_t sVar4;
  UA_Subscription *pUVar5;
  
  __nmemb = request->subscriptionIdsSize;
  if (__nmemb == 0) {
    UVar2 = 0x800f0000;
  }
  else {
    pUVar3 = (UA_StatusCode *)calloc(__nmemb,4);
    response->results = pUVar3;
    if (pUVar3 != (UA_StatusCode *)0x0) {
      response->resultsSize = __nmemb;
      pUVar1 = request->subscriptionIds;
      sVar4 = 0;
      do {
        pUVar5 = (UA_Subscription *)&session->serverSubscriptions;
        do {
          pUVar5 = (pUVar5->listEntry).le_next;
          if (pUVar5 == (UA_Subscription *)0x0) goto LAB_0012556c;
        } while (pUVar5->subscriptionID != pUVar1[sVar4]);
        if (pUVar5 == (UA_Subscription *)0x0) {
LAB_0012556c:
          pUVar3[sVar4] = 0x80280000;
        }
        else if (pUVar5->publishingEnabled != request->publishingEnabled) {
          pUVar5->publishingEnabled = request->publishingEnabled;
          pUVar5->currentLifetimeCount = 0;
        }
        sVar4 = sVar4 + 1;
        if (sVar4 == __nmemb) {
          return;
        }
      } while( true );
    }
    UVar2 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void
Service_SetPublishingMode(UA_Server *server, UA_Session *session,
                          const UA_SetPublishingModeRequest *request,
                          UA_SetPublishingModeResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing SetPublishingModeRequest");
    if(request->subscriptionIdsSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    size_t size = request->subscriptionIdsSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i) {
        UA_Subscription *sub =
            UA_Session_getSubscriptionByID(session, request->subscriptionIds[i]);
        if(!sub) {
            response->results[i] = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
            continue;
        }
        if(sub->publishingEnabled != request->publishingEnabled) {
            sub->publishingEnabled = request->publishingEnabled;
            sub->currentLifetimeCount = 0; /* Reset the subscription lifetime */
        }
    }
}